

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

pointer __thiscall
slang::SmallVectorBase<slang::IntervalMapDetails::Path::Entry>::
emplaceRealloc<slang::IntervalMapDetails::LeafNode<unsigned_long,slang::ast::Compilation::NetAlias_const*,8u,true>*&,unsigned_int&,unsigned_int&>
          (SmallVectorBase<slang::IntervalMapDetails::Path::Entry> *this,pointer pos,
          LeafNode<unsigned_long,_const_slang::ast::Compilation::NetAlias_*,_8U,_true> **args,
          uint *args_1,uint *args_2)

{
  size_type sVar1;
  size_type sVar2;
  size_type sVar3;
  iterator pEVar4;
  long lVar5;
  pointer pEVar6;
  iterator __result;
  uint32_t *in_RCX;
  undefined8 *in_RDX;
  iterator in_RSI;
  SmallVectorBase<slang::IntervalMapDetails::Path::Entry> *in_RDI;
  uint32_t *in_R8;
  pointer newPos;
  pointer newData;
  size_type offset;
  size_type newCap;
  Entry *in_stack_ffffffffffffff90;
  iterator __last;
  size_type in_stack_ffffffffffffffa0;
  
  sVar1 = in_RDI->len;
  sVar2 = max_size((SmallVectorBase<slang::IntervalMapDetails::Path::Entry> *)0x94fad5);
  if (sVar1 == sVar2) {
    detail::throwLengthError();
  }
  sVar3 = calculateGrowth(in_RDI,in_stack_ffffffffffffffa0);
  __last = in_RSI;
  pEVar4 = begin(in_RDI);
  lVar5 = (long)__last - (long)pEVar4;
  pEVar6 = (pointer)operator_new(0x94fb34);
  IntervalMapDetails::Path::Entry::
  Entry<slang::IntervalMapDetails::LeafNode<unsigned_long,slang::ast::Compilation::NetAlias_const*,8u,true>>
            (pEVar6 + (lVar5 >> 4),
             (LeafNode<unsigned_long,_const_slang::ast::Compilation::NetAlias_*,_8U,_true> *)*in_RDX
             ,*in_RCX,*in_R8);
  pEVar4 = end(in_RDI);
  if (in_RSI == pEVar4) {
    __result = begin(in_RDI);
    pEVar4 = end(in_RDI);
    std::
    uninitialized_move<slang::IntervalMapDetails::Path::Entry*,slang::IntervalMapDetails::Path::Entry*>
              (in_RSI,__last,__result);
  }
  else {
    begin(in_RDI);
    std::
    uninitialized_move<slang::IntervalMapDetails::Path::Entry*,slang::IntervalMapDetails::Path::Entry*>
              (in_RSI,__last,in_stack_ffffffffffffff90);
    pEVar4 = end(in_RDI);
    std::
    uninitialized_move<slang::IntervalMapDetails::Path::Entry*,slang::IntervalMapDetails::Path::Entry*>
              (in_RSI,__last,in_stack_ffffffffffffff90);
  }
  cleanup(in_RDI,(EVP_PKEY_CTX *)pEVar4);
  in_RDI->len = in_RDI->len + 1;
  in_RDI->cap = sVar3;
  in_RDI->data_ = pEVar6;
  return pEVar6 + (lVar5 >> 4);
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}